

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

void fmt::v5::internal::format_value<char,Date>(basic_buffer<char> *buffer,Date *value)

{
  basic_buffer<char> *in_RDI;
  basic_ostream<char,_std::char_traits<char>_> output;
  formatbuf<char> format_buf;
  basic_buffer<char> *in_stack_fffffffffffffe68;
  formatbuf<char> *in_stack_fffffffffffffe70;
  Date *d;
  streambuf *os;
  Date local_168 [22];
  streambuf local_58 [80];
  basic_buffer<char> *local_8;
  
  os = local_58;
  local_8 = in_RDI;
  formatbuf<char>::formatbuf(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::ostream::ostream(local_168,os);
  d = (Date *)((long)&local_168[0].year_ + *(long *)(local_168[0]._0_8_ + -0x18));
  std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((_Ios_Iostate)d);
  ::operator<<((ostream *)os,d);
  basic_buffer<char>::size(local_8);
  basic_buffer<char>::resize(local_8,(size_t)in_stack_fffffffffffffe68);
  std::ostream::~ostream(local_168);
  formatbuf<char>::~formatbuf((formatbuf<char> *)0x16f7be);
  return;
}

Assistant:

void format_value(basic_buffer<Char> &buffer, const T &value) {
  internal::formatbuf<Char> format_buf(buffer);
  std::basic_ostream<Char> output(&format_buf);
  output.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  output << value;
  buffer.resize(buffer.size());
}